

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
* __thiscall
Lexer::lexTheFlightTextFile_abi_cxx11_
          (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *__return_storage_ptr__,Lexer *this)

{
  pointer *this_00;
  int iVar1;
  initializer_list<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  byte bVar2;
  bool bVar3;
  ostream *this_01;
  istream *piVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  string *psVar9;
  pointer ppVar10;
  reference pbVar11;
  char cVar12;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_838;
  allocator local_7c1;
  value_type local_7c0;
  string local_7a0;
  string local_780;
  string local_760;
  string local_740;
  int local_71c;
  string local_718;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  undefined1 local_698 [8];
  string sec_right;
  string local_658;
  string local_638 [32];
  undefined1 local_618 [8];
  string right_1;
  string local_5d8;
  undefined1 local_5b8 [8];
  string left_1;
  size_type has_op;
  string op;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string local_538;
  _Self local_518;
  _Self local_510;
  iterator it;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  undefined1 local_448 [8];
  string right;
  string local_408;
  undefined1 local_3e8 [8];
  string left;
  string local_3a8;
  allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_382;
  less<int> local_381;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_380;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_378;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_350;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_328;
  iterator local_300;
  size_type local_2f8;
  undefined1 local_2f0 [8];
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  has_key_words;
  size_type has_end_condition;
  size_type has_print;
  size_type has_sim;
  size_type has_left_parent;
  size_type has_var;
  size_type has_if;
  size_type has_while;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command_vector;
  undefined1 local_250 [8];
  string line;
  istream local_220 [8];
  ifstream inFile;
  Lexer *this_local;
  
  std::ifstream::ifstream(local_220);
  std::ifstream::open(local_220,this,8);
  bVar2 = std::ios::fail();
  if ((bVar2 & 1) != 0) {
    this_01 = std::operator<<((ostream *)&std::cerr,"Error opeing a file");
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    std::ifstream::close();
    exit(1);
  }
  std::__cxx11::string::string((string *)local_250);
  do {
    do {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (local_220,(string *)local_250);
      bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar3) {
        std::ifstream::close();
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::vector(__return_storage_ptr__,&this->text_commands_lexed);
        local_71c = 1;
        std::__cxx11::string::~string((string *)local_250);
        std::ifstream::~ifstream(local_220);
        return __return_storage_ptr__;
      }
      uVar5 = std::__cxx11::string::empty();
    } while ((uVar5 & 1) != 0);
    trim((string *)
         &command_vector.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage,this,(string *)local_250);
    this_00 = &command_vector.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::operator=((string *)local_250,(string *)this_00);
    std::__cxx11::string::~string((string *)this_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&has_while);
    has_if = std::__cxx11::string::find((char *)local_250,0x12005d);
    has_var = std::__cxx11::string::find((char *)local_250,0x120063);
    has_left_parent = std::__cxx11::string::find((char *)local_250,0x12004d);
    cVar12 = (char)(string *)local_250;
    lVar6 = std::__cxx11::string::find(cVar12,0x28);
    lVar7 = std::__cxx11::string::find((char *)local_250,0x120973);
    lVar8 = std::__cxx11::string::find((char *)local_250,0x120051);
    has_key_words._M_t._M_impl.super__Rb_tree_header._M_node_count =
         std::__cxx11::string::find(cVar12,0x7d);
    local_380 = &local_378;
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<unsigned_long_&,_const_char_(&)[6],_true>(local_380,&has_if,(char (*) [6])"while");
    local_380 = &local_350;
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<unsigned_long_&,_const_char_(&)[3],_true>(local_380,&has_var,(char (*) [3])"if");
    local_380 = &local_328;
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<unsigned_long_&,_const_char_(&)[4],_true>(local_380,&has_left_parent,(char (*) [4])"var")
    ;
    local_300 = &local_378;
    local_2f8 = 3;
    std::
    allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::allocator(&local_382);
    __l._M_len = local_2f8;
    __l._M_array = local_300;
    std::
    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_2f0,__l,&local_381,&local_382);
    std::
    allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~allocator(&local_382);
    local_838 = (pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_300;
    do {
      local_838 = local_838 + -1;
      std::
      pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(local_838);
    } while (local_838 != &local_378);
    if (((has_var == 0xffffffffffffffff) && (has_if == 0xffffffffffffffff)) &&
       (has_left_parent == 0xffffffffffffffff)) {
      if (lVar8 == -1) {
        std::__cxx11::string::string((string *)(left.field_2._M_local_buf + 8),(string *)local_250);
        removeToken(&local_3a8,(string *)((long)&left.field_2 + 8),' ');
        std::__cxx11::string::operator=((string *)local_250,(string *)&local_3a8);
        std::__cxx11::string::~string((string *)&local_3a8);
        std::__cxx11::string::~string((string *)(left.field_2._M_local_buf + 8));
      }
      lVar7 = std::__cxx11::string::find((char)local_250,0x3d);
      if (lVar7 == -1) {
        if (lVar6 != -1) {
          std::__cxx11::string::substr((ulong)local_3e8,(ulong)local_250);
          std::__cxx11::string::string
                    ((string *)(right.field_2._M_local_buf + 8),(string *)local_3e8);
          removeToken(&local_408,(string *)((long)&right.field_2 + 8),'(');
          std::__cxx11::string::operator=((string *)local_3e8,(string *)&local_408);
          std::__cxx11::string::~string((string *)&local_408);
          std::__cxx11::string::~string((string *)(right.field_2._M_local_buf + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&has_while,(value_type *)local_3e8);
          psVar9 = (string *)std::__cxx11::string::erase((ulong)local_250,0);
          std::__cxx11::string::string((string *)local_448,psVar9);
          std::__cxx11::string::string((string *)&local_488,(string *)local_448);
          removeToken(&local_468,&local_488,'(');
          std::__cxx11::string::operator=((string *)local_448,(string *)&local_468);
          std::__cxx11::string::~string((string *)&local_468);
          std::__cxx11::string::~string((string *)&local_488);
          std::__cxx11::string::string((string *)&local_4c8,(string *)local_448);
          removeToken(&local_4a8,&local_4c8,')');
          std::__cxx11::string::operator=((string *)local_448,(string *)&local_4a8);
          std::__cxx11::string::~string((string *)&local_4a8);
          std::__cxx11::string::~string((string *)&local_4c8);
          std::__cxx11::string::string((string *)&it,(string *)local_448);
          removeToken(&local_4e8,(string *)&it,'\"');
          std::__cxx11::string::operator=((string *)local_448,(string *)&local_4e8);
          std::__cxx11::string::~string((string *)&local_4e8);
          std::__cxx11::string::~string((string *)&it);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&has_while,(value_type *)local_448);
          std::__cxx11::string::~string((string *)local_448);
          std::__cxx11::string::~string((string *)local_3e8);
        }
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&has_while,(value_type *)local_250);
      }
    }
    else {
      local_510._M_node =
           (_Base_ptr)
           std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_2f0);
      while( true ) {
        local_518._M_node =
             (_Base_ptr)
             std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_2f0);
        bVar3 = std::operator!=(&local_510,&local_518);
        if (!bVar3) break;
        ppVar10 = std::
                  _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator->(&local_510);
        if (ppVar10->first != -1) {
          ppVar10 = std::
                    _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator->(&local_510);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&has_while,&ppVar10->second);
          ppVar10 = std::
                    _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator->(&local_510);
          iVar1 = ppVar10->first;
          std::
          _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator->(&local_510);
          std::__cxx11::string::size();
          std::__cxx11::string::erase((ulong)local_250,(long)iVar1);
          std::__cxx11::string::string((string *)&__range3,(string *)local_250);
          removeToken(&local_538,(string *)&__range3,' ');
          std::__cxx11::string::operator=((string *)local_250,(string *)&local_538);
          std::__cxx11::string::~string((string *)&local_538);
          std::__cxx11::string::~string((string *)&__range3);
        }
        std::
        _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator++(&local_510);
      }
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->operators_to_check);
      op.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->operators_to_check);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)((long)&op.field_2 + 8)), bVar3) {
        pbVar11 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end3);
        std::__cxx11::string::string((string *)&has_op,(string *)pbVar11);
        left_1.field_2._8_8_ = std::__cxx11::string::find((string *)local_250,(ulong)&has_op);
        if (left_1.field_2._8_8_ == -1) {
          local_71c = 0;
        }
        else {
          std::__cxx11::string::substr((ulong)local_5b8,(ulong)local_250);
          std::__cxx11::string::string
                    ((string *)(right_1.field_2._M_local_buf + 8),(string *)local_5b8);
          removeToken(&local_5d8,(string *)((long)&right_1.field_2 + 8),'(');
          std::__cxx11::string::operator=((string *)local_5b8,(string *)&local_5d8);
          std::__cxx11::string::~string((string *)&local_5d8);
          std::__cxx11::string::~string((string *)(right_1.field_2._M_local_buf + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&has_while,(value_type *)local_5b8);
          std::__cxx11::string::erase((ulong)local_250,0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&has_while,(value_type *)&has_op);
          std::__cxx11::string::size();
          std::__cxx11::string::erase((ulong)local_250,0);
          std::__cxx11::string::string((string *)local_618,(string *)local_250);
          if (lVar7 == -1) {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&has_op,"<-");
            if ((bVar3) ||
               (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&has_op,"->"), bVar3)) {
              std::__cxx11::string::string((string *)&local_760,(string *)local_618);
              removeToken(&local_740,&local_760,')');
              std::__cxx11::string::operator=((string *)local_618,(string *)&local_740);
              std::__cxx11::string::~string((string *)&local_740);
              std::__cxx11::string::~string((string *)&local_760);
            }
            std::__cxx11::string::string((string *)&local_7a0,(string *)local_618);
            removeToken(&local_780,&local_7a0,'{');
            std::__cxx11::string::operator=((string *)local_618,(string *)&local_780);
            std::__cxx11::string::~string((string *)&local_780);
            std::__cxx11::string::~string((string *)&local_7a0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&has_while,(value_type *)local_618);
            local_71c = 7;
          }
          else {
            std::__cxx11::string::substr((ulong)local_638,(ulong)local_250);
            std::__cxx11::string::operator=((string *)local_5b8,local_638);
            std::__cxx11::string::~string(local_638);
            std::__cxx11::string::string
                      ((string *)(sec_right.field_2._M_local_buf + 8),(string *)local_5b8);
            removeToken(&local_658,(string *)((long)&sec_right.field_2 + 8),'(');
            std::__cxx11::string::operator=((string *)local_5b8,(string *)&local_658);
            std::__cxx11::string::~string((string *)&local_658);
            std::__cxx11::string::~string((string *)(sec_right.field_2._M_local_buf + 8));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&has_while,(value_type *)local_5b8);
            std::__cxx11::string::erase((ulong)local_250,0);
            std::__cxx11::string::string((string *)local_698,(string *)local_250);
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&has_op,"<-");
            if ((bVar3) ||
               (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&has_op,"->"), bVar3)) {
              std::__cxx11::string::string((string *)&local_6d8,(string *)local_698);
              removeToken(&local_6b8,&local_6d8,')');
              std::__cxx11::string::operator=((string *)local_698,(string *)&local_6b8);
              std::__cxx11::string::~string((string *)&local_6b8);
              std::__cxx11::string::~string((string *)&local_6d8);
            }
            std::__cxx11::string::string((string *)&local_718,(string *)local_698);
            removeToken(&local_6f8,&local_718,'\"');
            std::__cxx11::string::operator=((string *)local_698,(string *)&local_6f8);
            std::__cxx11::string::~string((string *)&local_6f8);
            std::__cxx11::string::~string((string *)&local_718);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&has_while,(value_type *)local_698);
            local_71c = 7;
            std::__cxx11::string::~string((string *)local_698);
          }
          std::__cxx11::string::~string((string *)local_618);
          std::__cxx11::string::~string((string *)local_5b8);
        }
        std::__cxx11::string::~string((string *)&has_op);
        if (local_71c != 0) break;
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
    }
    if (has_key_words._M_t._M_impl.super__Rb_tree_header._M_node_count != 0xffffffffffffffff) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_7c0,"}",&local_7c1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&has_while,&local_7c0);
      std::__cxx11::string::~string((string *)&local_7c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
    }
    std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::push_back(&this->text_commands_lexed,(value_type *)&has_while);
    std::
    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_2f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&has_while);
  } while( true );
}

Assistant:

vector<vector<string>> Lexer::lexTheFlightTextFile() {

  ifstream inFile; // open the file stream
  inFile.open(this->flight_text_file);
  if (inFile.fail()) { // check if opening a file failed
    cerr << "Error opeing a file" << endl;
    inFile.close();
    exit(1);
  }
  string line;
  // lex line after line - i chose to work in the onion slicing method
  while (getline(inFile, line)) {
    if (line.empty()) {
      continue;
    }
    // get rid of tabs
    line = trim(line);
    vector<string> command_vector;
    // important keyword i look for in the string
    string::size_type has_while = line.find("while");
    string::size_type has_if = line.find("if");
    string::size_type has_var = line.find("var");
    string::size_type has_left_parent = line.find('(');
    string::size_type has_sim = line.find("sim");
    string::size_type has_print = line.find("Print");
    string::size_type has_end_condition = line.find('}');
    map<int, string> has_key_words = {{has_while, "while"}, {has_if, "if"},
                                      {has_var, "var"}};
    // NOT var / while / if :
    if (has_if == string::npos && has_while == string::npos && has_var ==
        string::npos) {
      // get rid of spaces in case its not a print
      if (has_print == string::npos) {
        line = this->removeToken(line, ' ');
      }
      // assignments (set vars)
      if (line.find('=') != string::npos) {
        command_vector.push_back(line);
      } else if (has_left_parent != string::npos) {
        string left = line.substr(0, has_left_parent);
        left = this->removeToken(left, '(');
        command_vector.push_back(left);
        string right = line.erase(0, has_left_parent);
        right = this->removeToken(right, '(');
        right = this->removeToken(right, ')');
        right = this->removeToken(right, '"');
        command_vector.push_back(right);
      }
    } else {
      // var / while / if :
      // dont minimize spaces after the keyword while, if, var
      // put the keyword in a command vector and remove her from line :)
      for (auto it = has_key_words.begin(); it != has_key_words.end(); ++it) {
        if (string::size_type(it->first) != string::npos) {
          command_vector.push_back(it->second);
          line.erase(it->first, it->second.size());
          line = this->removeToken(line, ' ');
        }
      }
      // find "<-" , "->" , "=", "<=" , "<", ">" , ">=" .
      // put every part (left, keyword, right" inside command vector
      for (string op : this->operators_to_check) {
        string::size_type has_op = line.find(op);
        if (has_op != string::npos) {
          string left = line.substr(0, has_op);
          left = this->removeToken(left, '(');
          command_vector.push_back(left);
          line.erase(0, has_op);
          command_vector.push_back(op);
          line.erase(0, op.size());
          string right = line;
          if (has_sim != string::npos) {
            left = line.substr(0, 4);
            left = this->removeToken(left, '(');
            command_vector.push_back(left);
            line.erase(0, 4);
            string sec_right = line;
            if (op == "<-" || op == "->") {
              sec_right = this->removeToken(sec_right, ')');
            }
            sec_right = this->removeToken(sec_right, '"');
            command_vector.push_back(sec_right);
            break;
          }
          if (op == "<-" || op == "->") {
            right = this->removeToken(right, ')');
          }
          right = this->removeToken(right, '{');
          command_vector.push_back(right);
          break;
        }
      }
    }
    if (has_end_condition != string::npos) {
      command_vector.push_back("}");
    }
    text_commands_lexed.push_back(command_vector);
  }
  // close the file stream
  inFile.close();
  // return the vector of vectors :) (all the strings representing commands)
  return this->text_commands_lexed;
}